

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

bool __thiscall QHostAddress::setAddress(QHostAddress *this,QString *address)

{
  bool bVar1;
  
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(&this->d);
  bVar1 = QHostAddressPrivate::parse((this->d).d.ptr,address);
  return bVar1;
}

Assistant:

bool QHostAddress::setAddress(const QString &address)
{
    d.detach();
    return d->parse(address);
}